

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::become_follower(raft_server *this)

{
  element_type *peVar1;
  _Hash_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  context *pcVar4;
  int iVar5;
  _Hash_node_base *p_Var6;
  Param param;
  uint64_t my_term;
  string local_60;
  undefined4 local_3c;
  __atomic_base<unsigned_long> local_38;
  string *local_30;
  
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar5 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (3 < iVar5) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_60,"[BECOME FOLLOWER] term %lu",
                 (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"become_follower",0x525,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(int32)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(int32)local_60._M_dataplus._M_p
                                   ));
      }
    }
  }
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->cli_lock_);
  if (iVar5 == 0) {
    for (p_Var6 = (this->peers_)._M_h._M_before_begin._M_nxt; p_Var6 != (_Hash_node_base *)0x0;
        p_Var6 = p_Var6->_M_nxt) {
      p_Var2 = p_Var6[2]._M_nxt;
      if (((ulong)p_Var2[0x4d]._M_nxt & 0x100) == 0) {
        *(undefined1 *)((long)&p_Var2[0x11]._M_nxt + 2) = 0;
        (*(code *)(p_Var2[2]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var2[2]._M_nxt,p_Var2 + 0x12);
        LOCK();
        *(undefined1 *)&p_Var2[0x12]._M_nxt[1]._M_nxt = 1;
        UNLOCK();
      }
    }
    p_Var3 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    LOCK();
    (this->role_)._M_i = follower;
    UNLOCK();
    local_60._M_dataplus._M_p._0_4_ = this->id_;
    local_60._M_dataplus._M_p._4_4_ = (this->leader_).super___atomic_base<int>._M_i;
    local_60._M_string_length._0_4_ = 0xffffffff;
    local_38._M_i =
         (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->term_).super___atomic_base<unsigned_long>._M_i;
    local_60.field_2._M_allocated_capacity = (size_type)&local_38;
    pcVar4 = (this->ctx_)._M_t.
             super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
             super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
             super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
    if (*(long *)(pcVar4 + 0x80) != 0) {
      local_3c = 0xb;
      local_30 = &local_60;
      (**(code **)(pcVar4 + 0x88))(pcVar4 + 0x70);
    }
    LOCK();
    (this->write_paused_)._M_base._M_i = false;
    UNLOCK();
    LOCK();
    (this->next_leader_candidate_).super___atomic_base<int>._M_i = -1;
    UNLOCK();
    LOCK();
    (this->initialized_)._M_base._M_i = true;
    UNLOCK();
    p_Var3 = (this->uncommitted_config_).
             super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->uncommitted_config_).
    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->uncommitted_config_).
    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    LOCK();
    (this->pre_vote_).quorum_reject_count_.super___atomic_base<int>._M_i = 0;
    UNLOCK();
    LOCK();
    (this->pre_vote_).failure_count_.super___atomic_base<int>._M_i = 0;
    UNLOCK();
    drop_all_pending_commit_elems(this);
    pthread_mutex_unlock((pthread_mutex_t *)&this->cli_lock_);
    restart_election_timer(this);
    return;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

void raft_server::become_follower() {
    // stop hb for all peers
    p_in("[BECOME FOLLOWER] term %" PRIu64 "", state_->get_term());
    {   std::lock_guard<std::mutex> ll(cli_lock_);
        for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
            it->second->enable_hb(false);
        }

        srv_to_join_.reset();
        role_ = srv_role::follower;

        cb_func::Param param(id_, leader_);
        uint64_t my_term = state_->get_term();
        param.ctx = &my_term;
        (void) ctx_->cb_func_.call(cb_func::BecomeFollower, &param);

        write_paused_ = false;
        next_leader_candidate_ = -1;
        initialized_ = true;
        uncommitted_config_.reset();
        pre_vote_.quorum_reject_count_ = 0;
        pre_vote_.failure_count_ = 0;

        // Drain all pending callback functions.
        drop_all_pending_commit_elems();
    }

    restart_election_timer();
}